

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

realtype N_VWL2Norm_SensWrapper(N_Vector x,N_Vector w)

{
  realtype rVar1;
  realtype tmp;
  realtype nrm;
  int i;
  N_Vector w_local;
  N_Vector x_local;
  
  tmp = 0.0;
  for (nrm._4_4_ = 0; nrm._4_4_ < *(int *)((long)x->content + 8); nrm._4_4_ = nrm._4_4_ + 1) {
    rVar1 = N_VWL2Norm(*(N_Vector *)(*x->content + (long)nrm._4_4_ * 8),
                       *(N_Vector *)(*w->content + (long)nrm._4_4_ * 8));
    if (tmp < rVar1) {
      tmp = rVar1;
    }
  }
  return tmp;
}

Assistant:

realtype N_VWL2Norm_SensWrapper(N_Vector x, N_Vector w)
{
  int i;
  realtype nrm, tmp;

  nrm = ZERO;

  for (i=0; i < NV_NVECS_SW(x); i++) {
    tmp = N_VWL2Norm(NV_VEC_SW(x,i), NV_VEC_SW(w,i));
    if (tmp > nrm) nrm = tmp;
  }

  return(nrm);
}